

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O3

void __thiscall avro::ostreambuf::~ostreambuf(ostreambuf *this)

{
  *(undefined ***)this = &PTR__ostreambuf_001db928;
  boost::detail::shared_count::~shared_count(&(this->buffer_).pimpl_.pn);
  *(code **)this = sysconf;
  std::locale::~locale((locale *)&this->field_0x38);
  operator_delete(this,0x50);
  return;
}

Assistant:

class AVRO_DECL ostreambuf : public std::streambuf {

  public:

    /// Default constructor creates a new OutputBuffer.
    ostreambuf() : 
        std::streambuf(),
        buffer_()
    { }

    /// Construct using an existing OutputBuffer.
    explicit ostreambuf(OutputBuffer &buffer) :
        std::streambuf(),
        buffer_( buffer )
    { }

    /// Return the buffer.
    const OutputBuffer &getBuffer() const {
        return buffer_;
    }

  protected:
    
    /// Write a single character to the stream.
    virtual int_type overflow(int_type c) 
    {
        buffer_.writeTo(static_cast<OutputBuffer::data_type>(c));
        return c;
    }